

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizeImage.cpp
# Opt level: O1

void resizeLatLong(EnvmapImage *image1,EnvmapImage *image2,Box2i *image2DataWindow,
                  float filterRadius,int numSamples)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Array2D<Imf_3_4::Rgba> *pAVar4;
  Rgba RVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  V3f dir;
  ulong local_88;
  V3f local_50;
  V3f local_40;
  
  iVar8 = (image2DataWindow->max).x;
  iVar1 = (image2DataWindow->min).x;
  iVar2 = (image2DataWindow->min).y;
  iVar3 = (image2DataWindow->max).y;
  EnvmapImage::resize(image2,ENVMAP_LATLONG,image2DataWindow);
  EnvmapImage::clear(image2);
  pAVar4 = EnvmapImage::pixels(image2);
  if (iVar2 <= iVar3) {
    iVar8 = iVar8 - iVar1;
    uVar6 = iVar8 + 1;
    lVar9 = 0;
    local_88 = 0;
    do {
      if (-1 < iVar8) {
        uVar7 = 0;
        do {
          Imf_3_4::LatLongMap::direction((Box *)&local_40,(Vec2 *)image2DataWindow);
          local_50.x = local_40.x;
          local_50.y = local_40.y;
          local_50.z = local_40.z;
          RVar5 = EnvmapImage::filteredLookup
                            (image1,&local_50,(filterRadius * 3.1415927) / (float)(int)uVar6,
                             numSamples);
          *(Rgba *)((long)&pAVar4->_data[uVar7].r._h + pAVar4->_sizeY * lVar9) = RVar5;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      local_88 = local_88 + 1;
      lVar9 = lVar9 + 8;
    } while (local_88 != (iVar3 - iVar2) + 1);
  }
  return;
}

Assistant:

void
resizeLatLong (
    const EnvmapImage& image1,
    EnvmapImage&       image2,
    const Box2i&       image2DataWindow,
    float              filterRadius,
    int                numSamples)
{
    int   w      = image2DataWindow.max.x - image2DataWindow.min.x + 1;
    int   h      = image2DataWindow.max.y - image2DataWindow.min.y + 1;
    float radius = 0.5f * 2 * M_PI * filterRadius / w;

    image2.resize (ENVMAP_LATLONG, image2DataWindow);
    image2.clear ();

    Array2D<Rgba>& pixels = image2.pixels ();

    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            V3f dir      = LatLongMap::direction (image2DataWindow, V2f (x, y));
            pixels[y][x] = image1.filteredLookup (dir, radius, numSamples);
        }
    }
}